

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_GetObjectSize
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_OBJECT_HANDLE hObject,CK_ULONG_PTR pulSize)

{
  Session *this_00;
  Token *pTVar1;
  long *plVar2;
  ulong uVar3;
  undefined8 *in_RCX;
  long in_RDI;
  CK_OBJECT_HANDLE unaff_retaddr;
  OSObject *object;
  Token *token;
  Session *session;
  CK_RV local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_8 = 400;
  }
  else if (in_RCX == (undefined8 *)0x0) {
    local_8 = 7;
  }
  else {
    this_00 = (Session *)HandleManager::getSession((HandleManager *)object,unaff_retaddr);
    if (this_00 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      pTVar1 = Session::getToken(this_00);
      if (pTVar1 == (Token *)0x0) {
        local_8 = 5;
      }
      else {
        plVar2 = (long *)HandleManager::getObject((HandleManager *)object,unaff_retaddr);
        if ((plVar2 != (long *)0x0) && (uVar3 = (**(code **)(*plVar2 + 0x50))(), (uVar3 & 1) != 0))
        {
          *in_RCX = 0xffffffffffffffff;
          return 0;
        }
        local_8 = 0x82;
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_GetObjectSize(CK_SESSION_HANDLE hSession, CK_OBJECT_HANDLE hObject, CK_ULONG_PTR pulSize)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pulSize == NULL) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL_PTR) return CKR_GENERAL_ERROR;

	// Check the object handle.
	OSObject *object = (OSObject *)handleManager->getObject(hObject);
	if (object == NULL_PTR || !object->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	*pulSize = CK_UNAVAILABLE_INFORMATION;

	return CKR_OK;
}